

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

int __thiscall CVmConsoleBanner::get_banner_info(CVmConsoleBanner *this,os_banner_info_t *info)

{
  int iVar1;
  os_banner_info_t *in_RSI;
  long in_RDI;
  int ret;
  
  iVar1 = os_banner_getinfo(*(void **)(in_RDI + 0x40),in_RSI);
  if ((iVar1 != 0) && (*(int *)(in_RDI + 0x48) == 2)) {
    in_RSI->style = in_RSI->style & 0xffffffffffffffdf;
  }
  return iVar1;
}

Assistant:

int CVmConsoleBanner::get_banner_info(os_banner_info_t *info)
{
    int ret;
    
    /* get the OS-level information */
    ret = os_banner_getinfo(banner_, info);

    /* make some adjustments if we got valid information back */
    if (ret)
    {
        /* 
         *   check the window type for further adjustments we might need to
         *   make to the data returned from the OS layer 
         */
        switch(win_type_)
        {
        case OS_BANNER_TYPE_TEXTGRID:
            /* 
             *   text grids don't support <TAB> alignment, even if the
             *   underlying OS banner says we do, because we simply don't
             *   support <TAB> (or any other HTML markups) in a text grid
             *   window 
             */
            info->style &= ~OS_BANNER_STYLE_TAB_ALIGN;
            break;

        default:
            /* other types don't require any adjustments */
            break;
        }
    }

    /* return the success indication */
    return ret;
}